

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O0

string * YAML::Exp::Escape_abi_cxx11_(Stream *in,int codeLength)

{
  char cVar1;
  ostream *this;
  undefined8 uVar2;
  int in_EDX;
  Stream *in_RSI;
  string *in_RDI;
  Mark MVar3;
  stringstream msg;
  uint value;
  int i;
  string str;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  uint in_stack_fffffffffffffc2c;
  string *__lhs;
  string local_3c0 [32];
  string local_3a0 [8];
  Mark *in_stack_fffffffffffffc68;
  string *in_stack_fffffffffffffc70;
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  undefined4 local_240;
  undefined1 local_239;
  Mark local_218;
  Mark local_208;
  stringstream local_1f8 [16];
  ostream local_1e8 [376];
  Mark local_70;
  Mark local_60;
  uint local_50;
  int local_3c;
  string local_38 [36];
  int local_14;
  Stream *local_10;
  
  __lhs = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  for (local_3c = 0; local_3c < local_14; local_3c = local_3c + 1) {
    cVar1 = YAML::Stream::get((Stream *)
                              CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    in_stack_fffffffffffffc2c = CONCAT13(cVar1,(int3)in_stack_fffffffffffffc2c);
    std::__cxx11::string::operator+=(local_38,cVar1);
  }
  local_70 = YAML::Stream::mark(local_10);
  local_60 = local_70;
  local_50 = ParseHex(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  if (((local_50 < 0xd800) || (0xdfff < local_50)) && (local_50 < 0x110000)) {
    if (local_50 < 0x80) {
      Str_abi_cxx11_(in_stack_fffffffffffffc2c);
    }
    else if (local_50 < 0x800) {
      Str_abi_cxx11_(in_stack_fffffffffffffc2c);
      Str_abi_cxx11_(in_stack_fffffffffffffc2c);
      std::operator+(__lhs,in_RDI);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_260);
    }
    else if (local_50 < 0x10000) {
      Str_abi_cxx11_(in_stack_fffffffffffffc2c);
      Str_abi_cxx11_(in_stack_fffffffffffffc2c);
      std::operator+(__lhs,in_RDI);
      Str_abi_cxx11_(in_stack_fffffffffffffc2c);
      std::operator+(__lhs,in_RDI);
      std::__cxx11::string::~string(local_300);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string(local_2c0);
    }
    else {
      Str_abi_cxx11_(in_stack_fffffffffffffc2c);
      Str_abi_cxx11_(in_stack_fffffffffffffc2c);
      std::operator+(__lhs,in_RDI);
      Str_abi_cxx11_(in_stack_fffffffffffffc2c);
      std::operator+(__lhs,in_RDI);
      Str_abi_cxx11_(in_stack_fffffffffffffc2c);
      std::operator+(__lhs,in_RDI);
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::string::~string(local_360);
    }
    local_240 = 1;
    std::__cxx11::string::~string(local_38);
    return __lhs;
  }
  std::__cxx11::stringstream::stringstream(local_1f8);
  this = std::operator<<(local_1e8,"invalid unicode: ");
  std::ostream::operator<<(this,local_50);
  local_239 = 1;
  uVar2 = __cxa_allocate_exception(0x40);
  MVar3 = YAML::Stream::mark(local_10);
  local_218 = MVar3;
  local_208 = MVar3;
  std::__cxx11::stringstream::str();
  ParserException::ParserException
            ((ParserException *)this,MVar3._0_8_,
             (string *)CONCAT44(MVar3.column,in_stack_fffffffffffffc00));
  local_239 = 0;
  __cxa_throw(uVar2,&ParserException::typeinfo,ParserException::~ParserException);
}

Assistant:

std::string Escape(Stream& in, int codeLength) {
  // grab string
  std::string str;
  for (int i = 0; i < codeLength; i++)
    str += in.get();

  // get the value
  unsigned value = ParseHex(str, in.mark());

  // legal unicode?
  if ((value >= 0xD800 && value <= 0xDFFF) || value > 0x10FFFF) {
    std::stringstream msg;
    msg << ErrorMsg::INVALID_UNICODE << value;
    throw ParserException(in.mark(), msg.str());
  }

  // now break it up into chars
  if (value <= 0x7F)
    return Str(value);

  if (value <= 0x7FF)
    return Str(0xC0 + (value >> 6)) + Str(0x80 + (value & 0x3F));

  if (value <= 0xFFFF)
    return Str(0xE0 + (value >> 12)) + Str(0x80 + ((value >> 6) & 0x3F)) +
           Str(0x80 + (value & 0x3F));

  return Str(0xF0 + (value >> 18)) + Str(0x80 + ((value >> 12) & 0x3F)) +
         Str(0x80 + ((value >> 6) & 0x3F)) + Str(0x80 + (value & 0x3F));
}